

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte endch;
  byte bVar1;
  xml_parse_result *pxVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  xml_encoding xVar6;
  undefined4 extraout_var;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  xml_node_struct *pxVar10;
  xml_node_struct *pxVar11;
  xml_attribute_struct *pxVar12;
  char_t *pcVar13;
  xml_node_struct **ppxVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  xml_parse_status xVar18;
  xml_parse_status xVar19;
  char *__function;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  undefined4 uVar23;
  ushort *puVar24;
  ushort *puVar25;
  byte *pbVar26;
  byte *pbVar27;
  byte *pbVar28;
  ushort uVar29;
  byte *pbVar30;
  void *pvVar31;
  ulong uVar32;
  size_t sVar33;
  byte *pbVar34;
  byte *pbVar35;
  char_t *buffer;
  size_t length;
  xml_parse_result result;
  byte *local_100;
  xml_parser local_f0;
  xml_parse_result *local_d8;
  xml_node_struct *local_d0;
  byte *local_c8;
  byte *local_c0;
  undefined4 local_b4;
  undefined8 local_b0;
  byte *local_a8;
  byte *pbStack_a0;
  xml_encoding local_98;
  undefined4 uStack_94;
  byte *local_90;
  byte *local_88;
  byte *local_80;
  xml_node_struct *local_78;
  uint local_6c;
  xml_node_struct *local_68;
  code *local_60;
  byte *local_58;
  xml_node_struct **local_50;
  code *local_48;
  code *local_40;
  byte *local_38;
  
  if (size != 0 && contents == (void *)0x0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return __return_storage_ptr__;
  }
  xVar6 = get_buffer_encoding(encoding,contents,size);
  local_b0 = CONCAT44(extraout_var,xVar6);
  pvVar31 = (void *)0x0;
  if (own) {
    pvVar31 = contents;
  }
  local_60 = (code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  local_c8 = (byte *)0x0;
  local_c0 = (byte *)0x0;
  local_d8 = __return_storage_ptr__;
  local_78 = root;
  if (xVar6 == encoding_utf8) {
LAB_00193d9e:
    bVar3 = get_mutable_buffer((char_t **)&local_c8,(size_t *)&local_c0,contents,size,is_mutable);
    goto LAB_00193dbc;
  }
  if ((xVar6 & ~encoding_utf8) == encoding_utf16_le) {
    uVar32 = size >> 1;
    lVar7 = 0;
    if (xVar6 == encoding_utf16_le) {
      uVar20 = uVar32;
      puVar24 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar15 = *puVar24;
          if (uVar15 < 0xd800) {
            lVar21 = 3 - (ulong)(uVar15 < 0x800);
            if (uVar15 < 0x80) {
              lVar21 = 1;
            }
            lVar7 = lVar7 + lVar21;
LAB_00193f8a:
            puVar25 = puVar24 + 1;
            lVar21 = -1;
          }
          else {
            if ((~uVar15 & 0xe000) == 0) {
              lVar7 = lVar7 + 3;
              goto LAB_00193f8a;
            }
            puVar25 = puVar24 + 1;
            lVar21 = -1;
            if (((uVar20 != 1) && ((uVar15 & 0xfc00) == 0xd800)) && ((*puVar25 & 0xfc00) == 0xdc00))
            {
              lVar7 = lVar7 + 4;
              puVar25 = puVar24 + 2;
              lVar21 = -2;
            }
          }
          uVar20 = uVar20 + lVar21;
          puVar24 = puVar25;
        } while (uVar20 != 0);
      }
      pbVar34 = (byte *)(lVar7 + 1);
      pbVar35 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pbVar34);
      bVar3 = pbVar35 != (byte *)0x0;
      if (bVar3) {
        pbVar30 = pbVar35;
        puVar24 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar15 = *puVar24;
            uVar22 = (uint)uVar15;
            if ((uVar15 < 0xd800) || ((~uVar15 & 0xe000) == 0)) {
              pbVar30 = utf8_writer::low(pbVar30,uVar22);
              puVar25 = puVar24 + 1;
              lVar21 = -1;
            }
            else {
              puVar25 = puVar24 + 1;
              lVar21 = -1;
              if ((uVar32 != 1) && ((uVar22 & 0xfc00) == 0xd800)) {
                uVar15 = *puVar25;
                if ((uVar15 & 0xfc00) == 0xdc00) {
                  uVar16 = (uVar22 << 10 & 0xffc00) + 0x10000;
                  *pbVar30 = (byte)(uVar16 >> 0x12) | 0xf0;
                  pbVar30[1] = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
                  pbVar30[2] = (byte)((uVar15 & 0x3c0 | uVar22 << 10) >> 6) & 0x3f | 0x80;
                  pbVar30[3] = (byte)uVar15 & 0x3f | 0x80;
                  pbVar30 = pbVar30 + 4;
                  puVar25 = puVar24 + 2;
                  lVar21 = -2;
                }
              }
            }
            uVar32 = uVar32 + lVar21;
            puVar24 = puVar25;
          } while (uVar32 != 0);
        }
        if (pbVar30 != pbVar35 + lVar7) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
LAB_00195687:
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                        ,0x8b1,__function);
        }
LAB_00193ecc:
        *pbVar30 = 0;
        local_c8 = pbVar35;
        local_c0 = pbVar34;
        goto LAB_001944ab;
      }
    }
    else {
      uVar20 = uVar32;
      puVar24 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar15 = *puVar24 << 8;
          uVar29 = uVar15 | *puVar24 >> 8;
          if (uVar29 < 0xd800) {
            lVar21 = 3 - (ulong)(uVar29 < 0x800);
            if (uVar29 < 0x80) {
              lVar21 = 1;
            }
            lVar7 = lVar7 + lVar21;
LAB_0019404c:
            puVar25 = puVar24 + 1;
            lVar21 = -1;
          }
          else {
            if ((~uVar29 & 0xe000) == 0) {
              lVar7 = lVar7 + 3;
              goto LAB_0019404c;
            }
            puVar25 = puVar24 + 1;
            lVar21 = -1;
            if (((uVar20 != 1) && ((uVar15 & 0xfc00) == 0xd800)) && ((*puVar25 & 0xfc) == 0xdc)) {
              lVar7 = lVar7 + 4;
              puVar25 = puVar24 + 2;
              lVar21 = -2;
            }
          }
          uVar20 = uVar20 + lVar21;
          puVar24 = puVar25;
        } while (uVar20 != 0);
      }
      pbVar34 = (byte *)(lVar7 + 1);
      pbVar35 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                  ::allocate)(pbVar34);
      bVar3 = pbVar35 != (byte *)0x0;
      if (bVar3) {
        pbVar30 = pbVar35;
        puVar24 = (ushort *)contents;
        if (1 < size) {
          do {
            uVar15 = *puVar24 << 8 | *puVar24 >> 8;
            uVar22 = (uint)uVar15;
            if ((uVar15 < 0xd800) || ((~uVar15 & 0xe000) == 0)) {
              pbVar30 = utf8_writer::low(pbVar30,uVar22);
              puVar25 = puVar24 + 1;
              lVar21 = -1;
            }
            else {
              puVar25 = puVar24 + 1;
              lVar21 = -1;
              if ((uVar32 != 1) && ((uVar22 & 0xfc00) == 0xd800)) {
                uVar15 = *puVar25;
                uVar16 = (uint)(ushort)(uVar15 << 8 | uVar15 >> 8);
                if ((uVar16 & 0xfc00) == 0xdc00) {
                  uVar17 = (uVar22 << 10 & 0xffc00) + 0x10000;
                  *pbVar30 = (byte)(uVar17 >> 0x12) | 0xf0;
                  pbVar30[1] = (byte)(uVar17 >> 0xc) & 0x3f | 0x80;
                  pbVar30[2] = (byte)((uVar16 & 0x3c0 | uVar22 << 10) >> 6) & 0x3f | 0x80;
                  pbVar30[3] = (byte)(uVar15 >> 8) & 0x3f | 0x80;
                  pbVar30 = pbVar30 + 4;
                  puVar25 = puVar24 + 2;
                  lVar21 = -2;
                }
              }
            }
            uVar32 = uVar32 + lVar21;
            puVar24 = puVar25;
          } while (uVar32 != 0);
        }
        if (pbVar30 != pbVar35 + lVar7) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_00195687;
        }
        goto LAB_00193ecc;
      }
    }
LAB_00193dbc:
    if (bVar3 == false) {
      xml_parse_result::xml_parse_result(local_d8);
      local_d8->status = status_out_of_memory;
      local_d8->offset = 0;
      goto LAB_00195542;
    }
  }
  else {
    if (xVar6 - encoding_utf32_le < 2) {
      uVar32 = size >> 2;
      if (xVar6 == encoding_utf32_le) {
        if (size < 4) {
          lVar7 = 0;
        }
        else {
          uVar20 = 0;
          lVar7 = 0;
          do {
            uVar22 = *(uint *)((long)contents + uVar20 * 4);
            lVar21 = 4;
            if ((uVar22 < 0x10000) && (lVar21 = 1, 0x7f < uVar22)) {
              lVar21 = 3 - (ulong)(uVar22 < 0x800);
            }
            lVar7 = lVar7 + lVar21;
            uVar20 = uVar20 + 1;
          } while (uVar32 != uVar20);
        }
        pbVar34 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        bVar3 = pbVar34 != (byte *)0x0;
        if (bVar3) {
          pbVar35 = pbVar34;
          if (3 < size) {
            uVar20 = 0;
            do {
              uVar22 = *(uint *)((long)contents + uVar20 * 4);
              if (uVar22 < 0x10000) {
                pbVar35 = utf8_writer::low(pbVar35,uVar22);
              }
              else {
                *pbVar35 = (byte)(uVar22 >> 0x12) | 0xf0;
                pbVar35[1] = (byte)(uVar22 >> 0xc) & 0x3f | 0x80;
                pbVar35[2] = (byte)(uVar22 >> 6) & 0x3f | 0x80;
                pbVar35[3] = (byte)uVar22 & 0x3f | 0x80;
                pbVar35 = pbVar35 + 4;
              }
              uVar20 = uVar20 + 1;
            } while (uVar32 != uVar20);
          }
          if (pbVar35 != pbVar34 + lVar7) {
            __function = 
            "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
            ;
            goto LAB_00195687;
          }
LAB_0019441b:
          local_100 = (byte *)(lVar7 + 1);
          *pbVar35 = 0;
          local_c8 = pbVar34;
          local_c0 = local_100;
          goto LAB_001944ab;
        }
      }
      else {
        if (size < 4) {
          lVar7 = 0;
        }
        else {
          uVar20 = 0;
          lVar7 = 0;
          do {
            uVar22 = *(uint *)((long)contents + uVar20 * 4);
            uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                     uVar22 << 0x18;
            lVar21 = 4;
            if ((uVar22 < 0x10000) && (lVar21 = 1, 0x7f < uVar22)) {
              lVar21 = 3 - (ulong)(uVar22 < 0x800);
            }
            lVar7 = lVar7 + lVar21;
            uVar20 = uVar20 + 1;
          } while (uVar32 != uVar20);
        }
        pbVar34 = (byte *)(*(code *)(anonymous_namespace)::
                                    xml_memory_management_function_storage<int>::allocate)();
        bVar3 = pbVar34 != (byte *)0x0;
        if (bVar3) {
          pbVar35 = pbVar34;
          if (3 < size) {
            uVar20 = 0;
            do {
              uVar22 = *(uint *)((long)contents + uVar20 * 4);
              uVar16 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                       uVar22 << 0x18;
              if (uVar16 < 0x10000) {
                pbVar35 = utf8_writer::low(pbVar35,uVar16);
              }
              else {
                *pbVar35 = (byte)(uVar16 >> 0x12) | 0xf0;
                pbVar35[1] = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
                pbVar35[2] = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                pbVar35[3] = (byte)(uVar22 >> 0x18) & 0x3f | 0x80;
                pbVar35 = pbVar35 + 4;
              }
              uVar20 = uVar20 + 1;
            } while (uVar32 != uVar20);
          }
          if (pbVar35 != pbVar34 + lVar7) {
            __function = 
            "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
            ;
            goto LAB_00195687;
          }
          goto LAB_0019441b;
        }
      }
      goto LAB_00193dbc;
    }
    if (xVar6 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x906,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    sVar33 = 0;
    sVar8 = sVar33;
    if (size != 0) {
      do {
        sVar8 = sVar33;
        if (*(char *)((long)contents + sVar33) < '\0') break;
        sVar33 = sVar33 + 1;
        sVar8 = size;
      } while (size != sVar33);
    }
    if (size <= sVar8) goto LAB_00193d9e;
    if (size == sVar8) {
      lVar7 = 0;
    }
    else {
      lVar7 = 0;
      uVar32 = sVar8;
      do {
        lVar7 = lVar7 + (ulong)(*(byte *)((long)contents + uVar32) >> 7) + 1;
        uVar32 = uVar32 + 1;
      } while (size != uVar32);
    }
    local_80 = (byte *)(sVar8 + lVar7 + 1);
    pbVar34 = (byte *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                                allocate)();
    bVar3 = pbVar34 != (byte *)0x0;
    if (pbVar34 == (byte *)0x0) goto LAB_00193dbc;
    lVar7 = lVar7 + sVar8;
    memcpy(pbVar34,contents,sVar8);
    pbVar35 = pbVar34 + sVar8;
    for (; size != sVar8; sVar8 = sVar8 + 1) {
      pbVar35 = utf8_writer::low(pbVar35,(uint)*(byte *)((long)contents + sVar8));
    }
    if (pbVar35 != pbVar34 + lVar7) {
      __assert_fail("oend == obegin + length",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x8df,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                   );
    }
    *pbVar35 = 0;
    local_c8 = pbVar34;
    local_c0 = local_80;
  }
LAB_001944ab:
  pbVar34 = local_c8;
  if (own) {
    if (contents != (void *)0x0 && local_c8 != (byte *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
    bVar3 = pbVar34 == (byte *)contents && !own;
  }
  else {
    bVar3 = local_c8 == (byte *)contents;
  }
  if (!bVar3) {
    *out_buffer = (char_t *)local_c8;
  }
  doc->buffer = (char_t *)local_c8;
  if (local_c0 != (byte *)0x0) {
    if (local_78->first_child == (xml_node_struct *)0x0) {
      local_68 = (xml_node_struct *)0x0;
    }
    else {
      local_68 = local_78->first_child->prev_sibling_c;
    }
    local_f0.alloc = &doc->super_xml_allocator;
    if (doc == (xml_document_struct *)0x0) {
      local_f0.alloc = (xml_allocator *)0x0;
    }
    local_f0.error_offset = (char_t *)0x0;
    local_f0.error_status = status_ok;
    endch = (local_c8 + -1)[(long)local_c0];
    (local_c8 + -1)[(long)local_c0] = 0;
    local_90 = local_c8;
    if ((*local_c8 == 0xef) && (local_c8[1] == 0xbb)) {
      local_90 = local_c8 + (ulong)(local_c8[2] == 0xbf) * 3;
    }
    local_80 = local_c8;
    local_50 = &local_78->first_child;
    local_38 = local_c0;
    local_88 = local_c0 + -1;
    local_40 = *(code **)((long)&PTR_parse_simple_001f9850 + (ulong)(options >> 1 & 0x78));
    local_48 = (code *)(&PTR_parse_001f98d0)[options >> 9 & 4 | options >> 4 & 3];
    local_6c = options & 0x22;
    pxVar11 = local_78;
    pbVar34 = local_90;
LAB_00194660:
    pbVar35 = pbVar34;
    if (*pbVar35 == 0) {
LAB_0019540a:
      if (pxVar11 != local_78) {
        local_f0.error_status = status_end_element_mismatch;
        local_f0.error_offset = (char_t *)pbVar35;
      }
      goto LAB_00195422;
    }
    if (*pbVar35 == 0x3c) {
      pbVar35 = pbVar35 + 1;
    }
    else {
      lVar7 = 0;
      do {
        lVar21 = lVar7;
        bVar5 = pbVar35[lVar21];
        lVar7 = lVar21 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar5] & 8) != 0);
      if ((bVar5 == 0x3c) || (bVar5 == 0)) {
        if (lVar7 == 1) {
          __assert_fail("mark != s",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                        ,0xd89,
                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                       );
        }
        pbVar34 = pbVar35 + lVar21;
        if (((options >> 0xb & 1) != 0 || (options & 0x408) == 0) ||
           (((options >> 10 & 1) != 0 &&
            (((bVar5 != 0x3c || (pbVar35[lVar7] != 0x2f)) ||
             (pxVar11->first_child != (xml_node_struct *)0x0)))))) goto LAB_00194660;
      }
      pbVar34 = pbVar35 + lVar21;
      if ((options >> 0xb & 1) == 0) {
        pbVar34 = pbVar35;
      }
      if (((options >> 0xc & 1) == 0) &&
         (pbVar35 = pbVar34, pxVar11->parent == (xml_node_struct *)0x0)) {
        do {
          bVar5 = *pbVar35;
          if (bVar5 == 0) goto LAB_0019540a;
          pbVar35 = pbVar35 + 1;
        } while (bVar5 != 0x3c);
      }
      else {
        pbVar35 = (byte *)(*local_48)(pbVar34);
        pbVar30 = local_90;
        if ((((options >> 0xd & 1) == 0) ||
            ((pxVar11->parent == (xml_node_struct *)0x0 ||
             (pxVar11->first_child != (xml_node_struct *)0x0)))) ||
           (pxVar11->value != (char_t *)0x0)) {
          if ((((options >> 0xe & 1) != 0) && (pxVar11->first_child != (xml_node_struct *)0x0)) &&
             (pxVar10 = pxVar11->first_child->prev_sibling_c, (pxVar10->header & 0xf) == 3)) {
            if (local_90 < pxVar10->value) {
              __assert_fail("merged_pcdata >= cursor->first_child->prev_sibling_c->value",
                            "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                            ,0xda4,
                            "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                           );
            }
            sVar8 = strlength((char_t *)local_90);
            sVar9 = strlen((char *)pbVar34);
            memmove(pbVar30 + sVar8,pbVar34,sVar9 + 1);
            local_90 = pbVar30 + sVar8 + sVar9;
            goto LAB_001947da;
          }
          pxVar10 = append_new_node(pxVar11,local_f0.alloc,node_pcdata);
          if (pxVar10 != (xml_node_struct *)0x0) {
            pxVar10->value = (char_t *)pbVar34;
            local_90 = pbVar34;
            goto LAB_001947da;
          }
          local_f0.error_status = status_out_of_memory;
          pxVar11 = (xml_node_struct *)0x0;
          cVar4 = '\x01';
          local_f0.error_offset = (char_t *)pbVar35;
        }
        else {
          pxVar11->value = (char_t *)pbVar34;
LAB_001947da:
          cVar4 = (*pbVar35 == 0) * '\x03';
        }
        if (cVar4 != '\0') {
          if (cVar4 == '\x03') goto LAB_0019540a;
          goto LAB_00195422;
        }
      }
    }
    bVar5 = *pbVar35;
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar5]) {
      if (bVar5 == 0x21) {
        bVar5 = pbVar35[1];
        if (bVar5 == 0x5b) {
          if (pbVar35[2] == 0x43) {
            if (pbVar35[3] == 0x44) {
              if (pbVar35[4] == 0x41) {
                if (pbVar35[5] == 0x54) {
                  if (pbVar35[6] == 0x41) {
                    if (pbVar35[7] == 0x5b) {
                      pbVar35 = pbVar35 + 8;
                      if ((options & 4) == 0) {
                        do {
                          if (*pbVar35 == 0x5d) {
                            if (pbVar35[1] == 0x5d) {
                              if ((pbVar35[2] == 0x3e) || (endch == 0x3e && pbVar35[2] == 0))
                              goto LAB_001953a4;
                            }
                          }
                          else if (*pbVar35 == 0) goto LAB_001953c0;
                          pbVar35 = pbVar35 + 1;
                        } while( true );
                      }
                      pxVar10 = append_new_node(pxVar11,local_f0.alloc,node_cdata);
                      if (pxVar10 == (xml_node_struct *)0x0) {
                        local_f0.error_status = status_out_of_memory;
                        local_f0.error_offset = (char_t *)pbVar35;
                      }
                      else {
                        pxVar10->value = (char_t *)pbVar35;
                        if ((options & 0x20) == 0) {
LAB_001952c1:
                          if (*pbVar35 == 0x5d) {
                            if (pbVar35[1] != 0x5d) goto LAB_001952fe;
                            if ((pbVar35[2] != 0x3e) && (endch != 0x3e || pbVar35[2] != 0))
                            goto LAB_001952fe;
                            *pbVar35 = 0;
LAB_001953a4:
                            pbVar35 = pbVar35 + 1;
                            goto LAB_001953a7;
                          }
                          if (*pbVar35 != 0) goto LAB_001952fe;
                          goto LAB_001953c0;
                        }
                        pbVar35 = (byte *)strconv_cdata((char_t *)pbVar35,endch);
                        if (pbVar35 != (byte *)0x0) {
LAB_001953a7:
                          pbVar34 = pbVar35 + (ulong)(pbVar35[1] == 0x3e) + 1;
                          goto LAB_00195268;
                        }
                        pbVar35 = (byte *)pxVar10->value;
LAB_001953c0:
                        local_f0.error_offset = (char_t *)pbVar35;
                        local_f0.error_status = status_bad_cdata;
                      }
                      pbVar34 = (byte *)0x0;
                      goto LAB_00195268;
                    }
                    local_f0.error_offset = (char_t *)(pbVar35 + 7);
                  }
                  else {
                    local_f0.error_offset = (char_t *)(pbVar35 + 6);
                  }
                }
                else {
                  local_f0.error_offset = (char_t *)(pbVar35 + 5);
                }
              }
              else {
                local_f0.error_offset = (char_t *)(pbVar35 + 4);
              }
            }
            else {
              local_f0.error_offset = (char_t *)(pbVar35 + 3);
            }
          }
          else {
            local_f0.error_offset = (char_t *)(pbVar35 + 2);
          }
LAB_0019525d:
          local_f0.error_status = status_bad_cdata;
          goto LAB_00195265;
        }
        if (bVar5 == 0x44) {
          if ((((pbVar35[2] == 0x4f) && (pbVar35[3] == 0x43)) && (pbVar35[4] == 0x54)) &&
             ((pbVar35[5] == 0x59 && (pbVar35[6] == 0x50)))) {
            if ((pbVar35[7] != 0x45) && (endch != 0x45 || pbVar35[7] != 0)) goto LAB_00194c26;
            if (pxVar11->parent == (xml_node_struct *)0x0) {
              pbVar34 = (byte *)xml_parser::parse_doctype_group
                                          (&local_f0,(char_t *)(pbVar35 + -1),endch);
              if (pbVar34 == (byte *)0x0) goto LAB_0019519c;
              bVar5 = *pbVar34;
              if ((bVar5 != 0x3e) && (endch != 0x3e || bVar5 != 0)) {
                __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                              ,0xc5e,
                              "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                             );
              }
              if (bVar5 != 0) {
                *pbVar34 = 0;
                pbVar34 = pbVar34 + 1;
              }
              if ((options >> 9 & 1) != 0) {
                pbVar35 = pbVar35 + 7;
                do {
                  pbVar30 = pbVar35 + 1;
                  pbVar35 = pbVar35 + 1;
                } while (((anonymous_namespace)::chartype_table[*pbVar30] & 8) != 0);
                pxVar10 = append_new_node(pxVar11,local_f0.alloc,node_doctype);
                if (pxVar10 == (xml_node_struct *)0x0) goto LAB_00195194;
                pxVar10->value = (char_t *)pbVar35;
              }
              goto LAB_00195268;
            }
            local_f0.error_status = status_bad_doctype;
            local_f0.error_offset = (char_t *)(pbVar35 + -1);
          }
          else {
LAB_00194c26:
            local_f0.error_offset = (char_t *)(pbVar35 + 1);
            if ((endch == 0x2d) && (pbVar34 = (byte *)local_f0.error_offset, bVar5 == 0))
            goto LAB_00194d7d;
            if ((endch == 0x5b) && (bVar5 == 0)) goto LAB_0019525d;
            local_f0.error_status = status_unrecognized_tag;
          }
          goto LAB_00195265;
        }
        if (bVar5 != 0x2d) goto LAB_00194c26;
        if (pbVar35[2] != 0x2d) {
          pbVar34 = pbVar35 + 2;
          goto LAB_00194d7d;
        }
        pbVar34 = pbVar35 + 3;
        pxVar10 = pxVar11;
        if ((options & 2) == 0) {
LAB_001949db:
          if (local_6c != 0x22) {
            do {
              if (*pbVar34 == 0x2d) {
                if (pbVar34[1] == 0x2d) {
                  if ((pbVar34[2] == 0x3e) || (endch == 0x3e && pbVar34[2] == 0)) {
                    if ((options & 2) != 0) {
                      *pbVar34 = 0;
                    }
                    pbVar34 = pbVar34 + (ulong)(pbVar34[2] == 0x3e) + 2;
                    goto LAB_00195268;
                  }
                }
              }
              else if (*pbVar34 == 0) goto LAB_00194d7d;
              pbVar34 = pbVar34 + 1;
            } while( true );
          }
          local_a8 = (byte *)0x0;
          pbStack_a0 = (byte *)0x0;
LAB_001949f7:
          do {
            pbVar35 = pbVar34;
            if (((anonymous_namespace)::chartype_table[*pbVar34] & 0x20) == 0) {
              if (((anonymous_namespace)::chartype_table[pbVar34[1]] & 0x20) != 0) {
                pbVar35 = pbVar34 + 1;
                goto LAB_00194aec;
              }
              if (((anonymous_namespace)::chartype_table[pbVar34[2]] & 0x20) != 0) {
                pbVar35 = pbVar34 + 2;
                goto LAB_00194aec;
              }
              bVar3 = ((anonymous_namespace)::chartype_table[pbVar34[3]] & 0x20) == 0;
              if (bVar3) {
                pbVar35 = pbVar34 + 4;
              }
              else {
                pbVar35 = pbVar34 + 3;
              }
            }
            else {
LAB_00194aec:
              bVar3 = false;
            }
            pbVar34 = pbVar35;
          } while (bVar3);
          bVar5 = *pbVar35;
          if (bVar5 == 0xd) {
            pbVar34 = pbVar35 + 1;
            *pbVar35 = 10;
            if (pbVar35[1] == 10) {
              if (local_a8 != (byte *)0x0) {
                if (pbVar34 < local_a8) {
                  __assert_fail("s >= end",
                                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                                ,0x999,
                                "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                               );
                }
                memmove(local_a8 + -(long)pbStack_a0,local_a8,(long)pbVar34 - (long)local_a8);
              }
              pbVar34 = pbVar35 + 2;
              pbStack_a0 = pbStack_a0 + 1;
              local_a8 = pbVar34;
            }
            goto LAB_001949f7;
          }
          if (bVar5 == 0x2d) {
            if ((pbVar35[1] == 0x2d) && ((pbVar35[2] == 0x3e || (endch == 0x3e && pbVar35[2] == 0)))
               ) {
              pcVar13 = gap::flush((gap *)&local_a8,(char_t *)pbVar35);
              *pcVar13 = '\0';
              pbVar34 = pbVar35 + (ulong)(pbVar35[2] == 0x3e) + 2;
              goto LAB_00194eba;
            }
          }
          else if (bVar5 == 0) goto LAB_00194eb4;
          pbVar34 = pbVar35 + 1;
          goto LAB_001949f7;
        }
        pxVar10 = append_new_node(pxVar11,local_f0.alloc,node_comment);
        if (pxVar10 != (xml_node_struct *)0x0) {
          pxVar10->value = (char_t *)pbVar34;
          goto LAB_001949db;
        }
LAB_00195194:
        local_f0.error_offset = (char_t *)pbVar34;
        local_f0.error_status = status_out_of_memory;
LAB_0019519c:
        pbVar34 = (byte *)0x0;
        goto LAB_00195268;
      }
      if (bVar5 == 0x3f) {
        pbVar34 = pbVar35 + 1;
        if (-1 < (char)(anonymous_namespace)::chartype_table[pbVar35[1]]) goto LAB_0019495d;
        lVar7 = 4;
        pbVar30 = pbVar35 + 3;
        pbVar27 = pbVar34;
        do {
          pbVar28 = pbVar27;
          pbVar26 = pbVar30;
          pbVar27 = pbVar28 + 1;
          lVar7 = lVar7 + -1;
          pbVar30 = pbVar26 + 1;
        } while (((anonymous_namespace)::chartype_table[*pbVar28] & 0x40) != 0);
        local_d0 = pxVar11;
        if (*pbVar28 == 0) {
          local_f0.error_status = status_bad_pi;
          local_f0.error_offset = (char_t *)pbVar28;
LAB_00194fd8:
          pbVar34 = (byte *)0x0;
          pxVar11 = local_d0;
        }
        else {
          if (((pbVar35[1] & 0xdf) == 0x58) && ((pbVar35[2] & 0xdf) == 0x4d)) {
            uVar23 = (undefined4)
                     CONCAT71((int7)((ulong)pbVar30 >> 8),lVar7 == 0 && (pbVar35[3] & 0xdf) == 0x4c)
            ;
          }
          else {
            uVar23 = 0;
          }
          uVar22 = 1;
          if ((char)uVar23 != '\0') {
            uVar22 = 0x100;
          }
          if ((options & uVar22) == 0) {
            do {
              if (*pbVar28 == 0x3f) {
                bVar5 = pbVar28[1];
                if ((bVar5 == 0x3e) || (endch == 0x3e && bVar5 == 0)) {
                  pbVar34 = pbVar28 + (ulong)(bVar5 == 0x3e) + 1;
                  goto LAB_00194fe2;
                }
              }
              else if (*pbVar28 == 0) goto LAB_00194e9a;
              pbVar28 = pbVar28 + 1;
            } while( true );
          }
          if ((char)uVar23 == '\0') {
            local_b4 = uVar23;
            pxVar11 = append_new_node(pxVar11,local_f0.alloc,node_pi);
            if (pxVar11 == (xml_node_struct *)0x0) goto LAB_00194fc3;
LAB_00194e1c:
            pxVar11->name = (char_t *)pbVar34;
            bVar5 = *pbVar28;
            *pbVar28 = 0;
            if ((ulong)bVar5 == 0x3f) {
              bVar5 = *pbVar27;
              if ((bVar5 == 0x3e) || (endch == 0x3e && bVar5 == 0)) {
                pbVar34 = pbVar27 + (bVar5 == 0x3e);
                pxVar11 = pxVar11->parent;
                goto LAB_00194fe2;
              }
            }
            else {
              pbVar34 = pbVar28;
              if (((anonymous_namespace)::chartype_table[bVar5] & 8) != 0) {
                do {
                  pbVar30 = pbVar26;
                  pbVar35 = pbVar34 + 1;
                  pbVar34 = pbVar34 + 1;
                  pbVar26 = pbVar30 + 1;
                } while (((anonymous_namespace)::chartype_table[*pbVar35] & 8) != 0);
                do {
                  if (pbVar30[-1] == 0x3f) {
                    if ((*pbVar30 == 0x3e) || (endch == 0x3e && *pbVar30 == 0)) {
                      if ((char)local_b4 == '\0') {
                        pxVar11->value = (char_t *)pbVar34;
                        pxVar11 = pxVar11->parent;
                        pbVar30[-1] = 0;
                        pbVar34 = pbVar30 + (*pbVar30 == 0x3e);
                      }
                      else {
                        pbVar30[-1] = 0x2f;
                      }
                      goto LAB_00194fe2;
                    }
                  }
                  else if (pbVar30[-1] == 0) goto LAB_00195228;
                  pbVar30 = pbVar30 + 1;
                } while( true );
              }
            }
            local_f0.error_status = status_bad_pi;
            local_f0.error_offset = (char_t *)pbVar27;
            goto LAB_00194fd8;
          }
          if (pxVar11->parent == (xml_node_struct *)0x0) {
            local_b4 = uVar23;
            local_58 = pbVar34;
            pxVar11 = append_new_node(pxVar11,local_f0.alloc,node_declaration);
            pbVar34 = local_58;
            if (pxVar11 != (xml_node_struct *)0x0) goto LAB_00194e1c;
LAB_00194fc3:
            local_f0.error_status = status_out_of_memory;
            local_f0.error_offset = (char_t *)pbVar28;
            goto LAB_00194fd8;
          }
          local_f0.error_status = status_bad_pi;
          pbVar34 = (byte *)0x0;
          local_f0.error_offset = (char_t *)pbVar28;
        }
        goto LAB_00194fe2;
      }
      if (bVar5 != 0x2f) {
        local_f0.error_status = (endch == 0x3f && bVar5 == 0) + status_unrecognized_tag;
        local_f0.error_offset = (char_t *)pbVar35;
        goto LAB_00195422;
      }
      pbVar35 = pbVar35 + 1;
      pbVar30 = (byte *)pxVar11->name;
      xVar19 = status_end_element_mismatch;
      xVar18 = status_end_element_mismatch;
      pbVar27 = pbVar35;
      pbVar34 = pbVar35;
      if (pbVar30 != (byte *)0x0) {
LAB_0019483a:
        bVar5 = *pbVar34;
        xVar19 = xVar18;
        if (((anonymous_namespace)::chartype_table[bVar5] & 0x40) != 0) goto code_r0x00194848;
        if (*pbVar30 == 0) {
          pxVar11 = pxVar11->parent;
          do {
            pbVar27 = pbVar34;
            bVar5 = *pbVar27;
            pbVar34 = pbVar27 + 1;
          } while (((anonymous_namespace)::chartype_table[bVar5] & 8) != 0);
          pbVar35 = pbVar27;
          if (bVar5 != 0) {
            if (bVar5 == 0x3e) {
              bVar3 = true;
              goto LAB_00194f06;
            }
            xVar19 = status_bad_end_element;
            goto LAB_00194ef8;
          }
          bVar3 = true;
          pbVar34 = pbVar27;
          xVar19 = status_bad_end_element;
          if (endch != 0x3e) goto LAB_00194ef8;
          goto LAB_00194f06;
        }
        pbVar27 = pbVar34;
        if (((bVar5 == 0) && (*pbVar30 == endch)) && (pbVar30[1] == 0)) {
          pbVar35 = pbVar34;
          xVar19 = status_bad_end_element;
        }
      }
LAB_00194ef8:
      bVar3 = false;
      pbVar34 = pbVar27;
      local_f0.error_offset = (char_t *)pbVar35;
      local_f0.error_status = xVar19;
LAB_00194f06:
      if (!bVar3) goto LAB_00195422;
      goto LAB_00194660;
    }
    pxVar11 = append_new_node(pxVar11,local_f0.alloc,node_element);
    if (pxVar11 == (xml_node_struct *)0x0) {
      local_f0.error_status = status_out_of_memory;
      local_f0.error_offset = (char_t *)pbVar35;
      goto LAB_00195422;
    }
    pxVar11->name = (char_t *)pbVar35;
    do {
      if (((anonymous_namespace)::chartype_table[*pbVar35] & 0x40) == 0) {
LAB_001948d5:
        bVar5 = 0;
      }
      else {
        if (((anonymous_namespace)::chartype_table[pbVar35[1]] & 0x40) == 0) {
          pbVar35 = pbVar35 + 1;
          goto LAB_001948d5;
        }
        if (((anonymous_namespace)::chartype_table[pbVar35[2]] & 0x40) == 0) {
          pbVar35 = pbVar35 + 2;
          goto LAB_001948d5;
        }
        bVar5 = ((anonymous_namespace)::chartype_table[pbVar35[3]] & 0x40) >> 6;
        if (bVar5 == 0) {
          pbVar35 = pbVar35 + 3;
        }
        else {
          pbVar35 = pbVar35 + 4;
        }
      }
    } while (bVar5 != 0);
    bVar5 = *pbVar35;
    uVar32 = (ulong)bVar5;
    pbVar34 = pbVar35 + 1;
    *pbVar35 = 0;
    if (uVar32 == 0x3e) goto LAB_00194660;
    if (((anonymous_namespace)::chartype_table[uVar32] & 8) != 0) goto LAB_00195002;
    if (uVar32 == 0) {
      pbVar34 = pbVar35;
      if (endch == 0x3e) goto LAB_00194660;
    }
    else {
      pbVar35 = pbVar34;
      if (bVar5 != 0x2f) goto LAB_001955d5;
      bVar5 = *pbVar34;
      if ((bVar5 == 0x3e) || (endch == 0x3e && bVar5 == 0)) {
        pxVar11 = pxVar11->parent;
        pbVar34 = pbVar34 + (bVar5 == 0x3e);
        goto LAB_00194660;
      }
    }
    goto LAB_001955d5;
  }
  xml_parse_result::xml_parse_result(local_d8);
  local_d8->status = ~options >> 8 & status_no_document_element;
  local_d8->offset = 0;
LAB_001954d6:
  xVar6 = (xml_encoding)local_b0;
  goto LAB_0019553b;
LAB_001952fe:
  pbVar35 = pbVar35 + 1;
  goto LAB_001952c1;
LAB_00194eb4:
  pbVar34 = (byte *)0x0;
LAB_00194eba:
  if (pbVar34 == (byte *)0x0) {
    pbVar34 = (byte *)pxVar10->value;
LAB_00194d7d:
    local_f0.error_offset = (char_t *)pbVar34;
    local_f0.error_status = status_bad_comment;
LAB_00195265:
    pbVar34 = (byte *)0x0;
  }
LAB_00195268:
  if (pbVar34 == (byte *)0x0) goto LAB_00195422;
  goto LAB_00194660;
LAB_00194e9a:
  local_f0.error_status = status_bad_pi;
  pbVar34 = (byte *)0x0;
  local_f0.error_offset = (char_t *)pbVar28;
  goto LAB_00194fe2;
LAB_00195228:
  pxVar11 = local_d0;
  pbVar34 = pbVar30 + -1;
LAB_0019495d:
  local_f0.error_offset = (char_t *)pbVar34;
  local_f0.error_status = status_bad_pi;
  pbVar34 = (byte *)0x0;
LAB_00194fe2:
  if (pbVar34 == (byte *)0x0) goto LAB_00195422;
  if (pxVar11 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xd75,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if ((pxVar11->header & 0xf) != 7) goto LAB_00194660;
LAB_00195002:
  while( true ) {
    do {
      pbVar35 = pbVar34;
      bVar5 = *pbVar35;
      pbVar34 = pbVar35 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar5] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar5]) break;
    pxVar12 = append_new_attribute(pxVar11,local_f0.alloc);
    if (pxVar12 == (xml_attribute_struct *)0x0) {
      pbVar34 = pbVar35;
      xVar19 = status_out_of_memory;
LAB_00195107:
      bVar3 = false;
      local_f0.error_offset = (char_t *)pbVar35;
      local_f0.error_status = xVar19;
    }
    else {
      pxVar12->name = (char_t *)pbVar35;
      do {
        if (((anonymous_namespace)::chartype_table[*pbVar35] & 0x40) == 0) {
LAB_0019508d:
          bVar5 = 0;
        }
        else {
          if (((anonymous_namespace)::chartype_table[pbVar35[1]] & 0x40) == 0) {
            pbVar35 = pbVar35 + 1;
            goto LAB_0019508d;
          }
          if (((anonymous_namespace)::chartype_table[pbVar35[2]] & 0x40) == 0) {
            pbVar35 = pbVar35 + 2;
            goto LAB_0019508d;
          }
          bVar5 = ((anonymous_namespace)::chartype_table[pbVar35[3]] & 0x40) >> 6;
          if (bVar5 == 0) {
            pbVar35 = pbVar35 + 3;
          }
          else {
            pbVar35 = pbVar35 + 4;
          }
        }
      } while (bVar5 != 0);
      bVar5 = *pbVar35;
      *pbVar35 = 0;
      while (pbVar35 = pbVar35 + 1, ((anonymous_namespace)::chartype_table[bVar5] & 8) != 0) {
        bVar5 = *pbVar35;
      }
      pbVar30 = pbVar35;
      pbVar34 = pbVar35;
      xVar19 = status_bad_attribute;
      if (bVar5 != 0x3d) goto LAB_00195107;
      do {
        pbVar35 = pbVar30;
        bVar5 = *pbVar35;
        pbVar30 = pbVar35 + 1;
      } while (((anonymous_namespace)::chartype_table[bVar5] & 8) != 0);
      if ((bVar5 != 0x22) && (pbVar34 = pbVar35, bVar5 != 0x27)) goto LAB_00195107;
      pxVar12->value = (char_t *)pbVar30;
      pbVar35 = (byte *)(*local_40)(pbVar30,(int)(char)bVar5);
      xVar19 = status_bad_attribute;
      if (pbVar35 == (byte *)0x0) {
        pbVar35 = (byte *)pxVar12->value;
        pbVar34 = (byte *)0x0;
        goto LAB_00195107;
      }
      bVar3 = true;
      pbVar34 = pbVar35;
      if ((char)(anonymous_namespace)::chartype_table[*pbVar35] < '\0') goto LAB_00195107;
    }
    if (!bVar3) goto LAB_00195422;
  }
  if (bVar5 == 0x3e) goto LAB_00194660;
  if (bVar5 == 0x2f) {
    if (*pbVar34 == 0x3e) {
      pxVar11 = pxVar11->parent;
      pbVar34 = pbVar35 + 2;
      goto LAB_00194660;
    }
    pbVar35 = pbVar34;
    if ((endch == 0x3e) && (*pbVar34 == 0)) {
      pxVar11 = pxVar11->parent;
      goto LAB_00194660;
    }
  }
  else if ((endch == 0x3e) && (pbVar34 = pbVar35, bVar5 == 0)) goto LAB_00194660;
LAB_001955d5:
  local_f0.error_offset = (char_t *)pbVar35;
  local_f0.error_status = status_bad_start_element;
  goto LAB_00195422;
code_r0x00194848:
  bVar1 = *pbVar30;
  pbVar27 = pbVar34 + 1;
  pbVar34 = pbVar34 + 1;
  pbVar30 = pbVar30 + 1;
  if (bVar5 != bVar1) goto LAB_00194ef8;
  goto LAB_0019483a;
LAB_00195422:
  xVar19 = local_f0.error_status;
  pbVar34 = (byte *)(local_f0.error_offset + -(long)local_80);
  if ((byte *)local_f0.error_offset == (byte *)0x0) {
    pbVar34 = (byte *)0x0;
  }
  xml_parse_result::xml_parse_result((xml_parse_result *)&local_a8);
  local_a8 = (byte *)CONCAT44(local_a8._4_4_,xVar19);
  pbStack_a0 = pbVar34;
  if (((long)pbVar34 < 0) || (local_38 < pbVar34)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xdff,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  xVar6 = (xml_encoding)local_b0;
  if (xVar19 == status_ok) {
    if (endch == 0x3c) {
      xml_parse_result::xml_parse_result(local_d8);
      local_d8->status = status_unrecognized_tag;
      local_d8->offset = (ptrdiff_t)local_88;
      goto LAB_001954d6;
    }
    if ((options >> 0xc & 1) == 0) {
      ppxVar14 = &local_68->next_sibling;
      if (local_68 == (xml_node_struct *)0x0) {
        ppxVar14 = local_50;
      }
      for (pxVar11 = *ppxVar14; pxVar11 != (xml_node_struct *)0x0; pxVar11 = pxVar11->next_sibling)
      {
        if ((pxVar11->header & 0xf) == 2) goto LAB_00195521;
      }
      if (pxVar11 == (xml_node_struct *)0x0) {
        xml_parse_result::xml_parse_result(local_d8);
        local_d8->status = status_no_document_element;
        local_d8->offset = (ptrdiff_t)local_88;
        goto LAB_0019553b;
      }
    }
  }
  else if (((0 < (long)pbVar34) && (pbVar34 == local_88)) && (endch == 0)) {
    pbStack_a0 = pbVar34 + -1;
  }
LAB_00195521:
  local_d8->encoding = local_98;
  *(undefined4 *)&local_d8->field_0x14 = uStack_94;
  *(byte **)local_d8 = local_a8;
  local_d8->offset = (ptrdiff_t)pbStack_a0;
LAB_0019553b:
  local_d8->encoding = xVar6;
  pvVar31 = (void *)0x0;
LAB_00195542:
  pxVar2 = local_d8;
  if (pvVar31 != (void *)0x0) {
    (*local_60)(pvVar31);
  }
  return pxVar2;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : NULL, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = NULL;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}